

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O1

Vec_Int_t *
Abc_NtkCollectCopies(Abc_Ntk_t *p,Gia_Man_t *pGia,Vec_Ptr_t **pvNodesR,Vec_Bit_t **pvPolar)

{
  uint *puVar1;
  int iVar2;
  Vec_Ptr_t *__ptr;
  Vec_Int_t *p_00;
  int *piVar3;
  Vec_Ptr_t *pVVar4;
  void **__s;
  void *__s_00;
  Vec_Bit_t *pVVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  Vec_Int_t *pVVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  char *local_58;
  
  piVar3 = (int *)0x0;
  __ptr = Abc_NtkDfs(p,0);
  iVar2 = p->vObjs->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar10 = iVar2;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar10;
  if (iVar10 != 0) {
    piVar3 = (int *)malloc((long)iVar10 << 2);
  }
  p_00->pArray = piVar3;
  uVar11 = pGia->nObjs;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  uVar13 = 8;
  if (6 < uVar11 - 1) {
    uVar13 = uVar11;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = uVar13;
  if (uVar13 == 0) {
    __s = (void **)0x0;
  }
  else {
    __s = (void **)malloc((long)(int)uVar13 << 3);
  }
  pVVar4->pArray = __s;
  pVVar4->nSize = uVar11;
  __s_00 = (void *)0x0;
  memset(__s,0,(long)(int)uVar11 << 3);
  iVar2 = (((int)uVar11 >> 5) + 1) - (uint)((uVar11 & 0x1f) == 0);
  iVar10 = iVar2 * 0x20;
  if (iVar2 != 0) {
    __s_00 = malloc((long)iVar2 * 4);
  }
  sVar7 = (long)iVar2 * 4;
  piVar3 = (int *)0x0;
  memset(__s_00,0,sVar7);
  pVVar5 = (Vec_Bit_t *)malloc(0x10);
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar10;
  if (iVar2 != 0) {
    piVar3 = (int *)malloc(sVar7);
  }
  pVVar5->pArray = piVar3;
  pVVar5->nSize = iVar10;
  memset(piVar3,0,sVar7);
  pVVar9 = pGia->vCis;
  if (0 < pVVar9->nSize) {
    lVar14 = 0;
    do {
      iVar2 = pVVar9->pArray[lVar14];
      if (((long)iVar2 < 0) || (pGia->nObjs <= iVar2)) goto LAB_003af91b;
      if (iVar2 == 0) break;
      if (p->vCis->nSize <= lVar14) goto LAB_003af93a;
      pcVar6 = Abc_ObjName((Abc_Obj_t *)p->vCis->pArray[lVar14]);
      if (pcVar6 == (char *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        sVar7 = strlen(pcVar6);
        pcVar8 = (char *)malloc(sVar7 + 1);
        strcpy(pcVar8,pcVar6);
      }
      if (pVVar4->nSize <= iVar2) goto LAB_003af959;
      pVVar4->pArray[iVar2] = pcVar8;
      lVar14 = lVar14 + 1;
      pVVar9 = pGia->vCis;
    } while (lVar14 < pVVar9->nSize);
  }
  pVVar9 = pGia->vCos;
  if (0 < pVVar9->nSize) {
    lVar14 = 0;
    do {
      iVar2 = pVVar9->pArray[lVar14];
      lVar15 = (long)iVar2;
      if ((lVar15 < 0) || (pGia->nObjs <= iVar2)) goto LAB_003af91b;
      if (iVar2 == 0) break;
      uVar11 = iVar2 - (*(uint *)(pGia->pObjs + lVar15) & 0x1fffffff);
      if (((int)uVar11 < 0) || (iVar10 <= (int)uVar11)) goto LAB_003af978;
      puVar1 = (uint *)((long)__s_00 + (ulong)(uVar11 >> 5) * 4);
      *puVar1 = *puVar1 | 1 << ((byte)uVar11 & 0x1f);
      if (p->vCos->nSize <= lVar14) goto LAB_003af93a;
      pcVar6 = Abc_ObjName((Abc_Obj_t *)p->vCos->pArray[lVar14]);
      if (pcVar6 == (char *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        sVar7 = strlen(pcVar6);
        pcVar8 = (char *)malloc(sVar7 + 1);
        strcpy(pcVar8,pcVar6);
      }
      if (pVVar4->nSize <= iVar2) goto LAB_003af959;
      pVVar4->pArray[lVar15] = pcVar8;
      Vec_IntPush(p_00,iVar2);
      lVar14 = lVar14 + 1;
      pVVar9 = pGia->vCos;
    } while (lVar14 < pVVar9->nSize);
  }
  if (0 < __ptr->nSize) {
    lVar14 = 0;
    do {
      uVar11 = (((Abc_Obj_t *)__ptr->pArray[lVar14])->field_6).iTemp;
      if (-1 < (int)uVar11) {
        uVar13 = uVar11 >> 1;
        if (pGia->nObjs <= (int)uVar13) {
LAB_003af91b:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if ((~*(uint *)(pGia->pObjs + uVar13) & 0x1fffffff) != 0 &&
            -1 < (int)*(uint *)(pGia->pObjs + uVar13)) {
          if (iVar10 <= (int)uVar13) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                          ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
          }
          uVar12 = (ulong)(uVar11 >> 6);
          if ((*(uint *)((long)__s_00 + uVar12 * 4) >> (uVar13 & 0x1f) & 1) == 0) {
            if (pVVar4->nSize <= (int)uVar13) {
LAB_003af93a:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            if (pVVar4->pArray[uVar13] == (void *)0x0) {
              pcVar6 = Abc_ObjName((Abc_Obj_t *)__ptr->pArray[lVar14]);
              if (pcVar6 == (char *)0x0) {
                local_58 = (char *)0x0;
              }
              else {
                sVar7 = strlen(pcVar6);
                local_58 = (char *)malloc(sVar7 + 1);
                strcpy(local_58,pcVar6);
              }
              if (pVVar4->nSize <= (int)uVar13) {
LAB_003af959:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                              ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
              }
              pVVar4->pArray[uVar13] = local_58;
              Vec_IntPush(p_00,uVar13);
              if (pVVar5->nSize <= (int)uVar13) {
LAB_003af978:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                              ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
              }
              uVar13 = 1 << (sbyte)(uVar13 & 0x1f);
              if ((uVar11 & 1) == 0) {
                pVVar5->pArray[uVar12] = pVVar5->pArray[uVar12] & ~uVar13;
              }
              else {
                pVVar5->pArray[uVar12] = pVVar5->pArray[uVar12] | uVar13;
              }
            }
          }
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < __ptr->nSize);
  }
  if (__s_00 != (void *)0x0) {
    free(__s_00);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
  if (__ptr != (Vec_Ptr_t *)0x0) {
    free(__ptr);
  }
  qsort(p_00->pArray,(long)p_00->nSize,4,Vec_IntSortCompare1);
  *pvNodesR = pVVar4;
  *pvPolar = pVVar5;
  return p_00;
}

Assistant:

Vec_Int_t * Abc_NtkCollectCopies( Abc_Ntk_t * p, Gia_Man_t * pGia, Vec_Ptr_t ** pvNodesR, Vec_Bit_t ** pvPolar )
{
    int i, iObj, iLit;
    Abc_Obj_t * pObj;
    Vec_Ptr_t * vObjs   = Abc_NtkDfs( p, 0 );
    Vec_Int_t * vNodes  = Vec_IntAlloc( Abc_NtkObjNumMax(p) );
    Vec_Ptr_t * vNodesR = Vec_PtrStart( Gia_ManObjNum(pGia) );
    Vec_Bit_t * vDriver = Vec_BitStart( Gia_ManObjNum(pGia) );
    Vec_Bit_t * vPolar  = Vec_BitStart( Gia_ManObjNum(pGia) );
    Gia_ManForEachCiId( pGia, iObj, i )
        Vec_PtrWriteEntry( vNodesR, iObj, Abc_UtilStrsav(Abc_ObjName(Abc_NtkCi(p, i))) );
    Gia_ManForEachCoId( pGia, iObj, i )
    {
        Vec_BitWriteEntry( vDriver, Gia_ObjFaninId0(Gia_ManObj(pGia, iObj), iObj), 1 );
        Vec_PtrWriteEntry( vNodesR, iObj, Abc_UtilStrsav(Abc_ObjName(Abc_NtkCo(p, i))) );
        Vec_IntPush( vNodes, iObj );
    }
    Vec_PtrForEachEntry( Abc_Obj_t *, vObjs, pObj, i )
        if ( (iLit = pObj->iTemp) >= 0 && Gia_ObjIsAnd(Gia_ManObj(pGia, Abc_Lit2Var(iLit))) )
        {
            if ( !Vec_BitEntry(vDriver, Abc_Lit2Var(iLit)) && Vec_PtrEntry(vNodesR, Abc_Lit2Var(iLit)) == NULL )
            {
                Vec_PtrWriteEntry( vNodesR, Abc_Lit2Var(iLit), Abc_UtilStrsav(Abc_ObjName(pObj)) );
                Vec_IntPush( vNodes, Abc_Lit2Var(iLit) );
                Vec_BitWriteEntry( vPolar, Abc_Lit2Var(iLit), Abc_LitIsCompl(iLit) );
            }
        }
    Vec_BitFree( vDriver );
    Vec_PtrFree( vObjs );
    Vec_IntSort( vNodes, 0 );
    *pvNodesR = vNodesR;
    *pvPolar  = vPolar;
    return vNodes;
}